

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O3

Vec_Ptr_t * Aig_ManTernarySimulate(Aig_Man_t *p,int fVerbose,int fVeryVerbose)

{
  long lVar1;
  byte bVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  Aig_Tsi_t *p_00;
  uint *puVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  char cVar16;
  uint uVar17;
  ulong uVar18;
  char *__format;
  
  p_00 = Aig_TsiStart(p);
  p->pConst1->field_0x1f = 2;
  uVar17 = p->nObjs[2] - p->nRegs;
  uVar18 = (ulong)uVar17;
  if (uVar17 != 0 && p->nRegs <= p->nObjs[2]) {
    lVar9 = 0;
    do {
      if (p->vCis->nSize <= lVar9) goto LAB_006d606b;
      pvVar3 = p->vCis->pArray[lVar9];
      *(ulong *)((long)pvVar3 + 0x18) =
           *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffff | 0x300000000000000;
      lVar9 = lVar9 + 1;
      uVar18 = (long)p->nObjs[2] - (long)p->nRegs;
    } while (lVar9 < (long)uVar18);
  }
  pVVar7 = p->vCis;
  if ((int)uVar18 < pVVar7->nSize) {
    uVar10 = uVar18 & 0xffffffff;
    do {
      if ((int)uVar18 < 0) goto LAB_006d606b;
      *(ulong *)((long)pVVar7->pArray[uVar10] + 0x18) =
           (*(ulong *)((long)pVVar7->pArray[uVar10] + 0x18) & 0xffffffffffffff) + 0x100000000000000;
      uVar10 = uVar10 + 1;
      pVVar7 = p->vCis;
    } while ((int)uVar10 < pVVar7->nSize);
  }
  uVar17 = 0;
LAB_006d5843:
  puVar6 = Aig_TsiStateNew(p_00);
  iVar5 = p->nRegs;
  if (0 < iVar5) {
    bVar13 = 0;
    uVar11 = 0;
    do {
      iVar14 = (p->nObjs[3] - iVar5) + uVar11;
      if ((((iVar14 < 0) || (p->vCos->nSize <= iVar14)) ||
          (uVar15 = (p->nObjs[2] - iVar5) + uVar11, (int)uVar15 < 0)) ||
         (p->vCis->nSize <= (int)uVar15)) goto LAB_006d606b;
      bVar2 = *(byte *)((long)p->vCis->pArray[uVar15] + 0x1f);
      if ((bVar2 & 1) != 0) {
        puVar6[uVar11 >> 4] = puVar6[uVar11 >> 4] | 1 << (bVar13 & 0x1e);
      }
      if ((bVar2 & 2) != 0) {
        puVar6[uVar11 >> 4] = puVar6[uVar11 >> 4] | 2 << (bVar13 & 0x1e);
      }
      uVar11 = uVar11 + 1;
      iVar5 = p->nRegs;
      bVar13 = bVar13 + 2;
    } while ((int)uVar11 < iVar5);
  }
  if (fVeryVerbose != 0) {
    printf("%3d : ",(ulong)uVar17);
    Aig_TsiStatePrint(p_00,puVar6);
  }
  uVar11 = p_00->nWords;
  iVar5 = Aig_TsiStateLookup(p_00,puVar6,uVar11);
  if (iVar5 == 0) goto code_r0x006d5935;
  if (uVar17 != 1000) {
    if (0 < p_00->vStates->nSize) {
      puVar6 = (uint *)*p_00->vStates->pArray;
      Aig_TsiStateOrAll(p_00,puVar6);
      iVar5 = p->nRegs;
      iVar14 = uVar11 * 0x20 + iVar5 * -2;
      if (iVar14 == 0) {
        if (0 < (int)uVar11) {
          uVar18 = 0;
          bVar4 = false;
          do {
            if (puVar6[uVar18] != 0xffffffff) {
              bVar4 = true;
            }
            uVar18 = uVar18 + 1;
          } while (uVar11 != uVar18);
LAB_006d5c56:
          if (bVar4) goto LAB_006d5c5a;
        }
        if (fVerbose == 0) goto LAB_006d5ba7;
        __format = "Detected 0 constants after %d iterations of ternary simulation.\n";
        uVar18 = (ulong)uVar17;
        goto LAB_006d5ba0;
      }
      if ((int)uVar11 < 2) {
        uVar18 = 0;
        bVar4 = false;
      }
      else {
        uVar18 = 0;
        bVar4 = false;
        do {
          if (puVar6[uVar18] != 0xffffffff) {
            bVar4 = true;
          }
          uVar18 = uVar18 + 1;
        } while (uVar11 - 1 != uVar18);
        uVar18 = (ulong)(uVar11 - 1);
      }
      if (puVar6[uVar18] == 0xffffffffU >> ((byte)iVar14 & 0x1f)) goto LAB_006d5c56;
LAB_006d5c5a:
      uVar11 = p->nObjs[2];
      pVVar7 = (Vec_Ptr_t *)malloc(0x10);
      uVar18 = 8;
      if (6 < uVar11 - 1) {
        uVar18 = (ulong)uVar11;
      }
      pVVar7->nSize = 0;
      iVar14 = (int)uVar18;
      pVVar7->nCap = iVar14;
      if (iVar14 == 0) {
        ppvVar8 = (void **)0x0;
      }
      else {
        ppvVar8 = (void **)malloc((long)iVar14 << 3);
      }
      pVVar7->pArray = ppvVar8;
      if (iVar5 < (int)uVar11) {
        lVar9 = 0;
        do {
          if (p->vCis->nSize <= lVar9) goto LAB_006d606b;
          pvVar3 = p->vCis->pArray[lVar9];
          iVar5 = (int)uVar18;
          if ((int)lVar9 == iVar5) {
            if (iVar5 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
              }
              pVVar7->pArray = ppvVar8;
              pVVar7->nCap = 0x10;
              uVar18 = 0x10;
            }
            else {
              uVar18 = (ulong)(uint)(iVar5 * 2);
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(uVar18 * 8);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,uVar18 * 8);
              }
              pVVar7->pArray = ppvVar8;
              pVVar7->nCap = iVar5 * 2;
            }
          }
          else {
            ppvVar8 = pVVar7->pArray;
          }
          lVar1 = lVar9 + 1;
          pVVar7->nSize = (int)lVar1;
          ppvVar8[lVar9] = pvVar3;
          iVar5 = p->nRegs;
          lVar9 = lVar1;
        } while (lVar1 < (long)p->nObjs[2] - (long)iVar5);
      }
      if (iVar5 < 1) {
        Aig_TsiStop(p_00);
        if (fVerbose == 0) {
          return pVVar7;
        }
        printf("Detected %d constants after %d iterations of ternary simulation.\n",0,(ulong)uVar17)
        ;
        return pVVar7;
      }
      iVar14 = p->nObjs[3] - iVar5;
      if (((-1 < iVar14) && (iVar14 < p->vCos->nSize)) &&
         ((iVar5 = p->nObjs[2] - iVar5, -1 < iVar5 && (iVar5 < p->vCis->nSize)))) {
        pVVar7 = (Vec_Ptr_t *)
                 (*(code *)(&DAT_00a26830 +
                           *(int *)(&DAT_00a26830 +
                                   (ulong)((uint)((*puVar6 & 1) != 0) + (*puVar6 >> 1 & 1) * 2) * 4)
                           ))();
        return pVVar7;
      }
    }
LAB_006d606b:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  goto LAB_006d5b94;
code_r0x006d5935:
  Aig_TsiStateInsert(p_00,puVar6,uVar11);
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      pvVar3 = pVVar7->pArray[lVar9];
      if ((pvVar3 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7))
      {
        bVar13 = (byte)((ulong)*(undefined8 *)
                                ((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18) >> 0x38
                       );
        uVar11 = (uint)bVar13;
        if ((*(ulong *)((long)pvVar3 + 8) & 1) != 0) {
          bVar13 = bVar13 - 1;
          if (2 < bVar13) goto LAB_006d608a;
          uVar11 = *(uint *)(&DAT_00a26a40 + (ulong)bVar13 * 4);
        }
        uVar18 = *(ulong *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x18);
        cVar16 = (char)(uVar18 >> 0x38);
        if ((*(ulong *)((long)pvVar3 + 0x10) & 1) == 0) {
LAB_006d59f0:
          uVar18 = 0x100000000000000;
          if ((((uVar11 != 1) && (uVar18 = 0x100000000000000, cVar16 != '\x01')) &&
              ((uVar18 = 0x300000000000000, uVar11 != 3 &&
               (uVar18 = 0x300000000000000, cVar16 != '\x03')))) &&
             ((uVar11 != 2 || (uVar18 = 0x200000000000000, cVar16 != '\x02')))) {
            __assert_fail("Value0 == AIG_XVS1 && Value1 == AIG_XVS1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTsim.c"
                          ,0x37,"int Aig_XsimAnd(int, int)");
          }
        }
        else {
          if (uVar18 >> 0x38 == 1) {
            cVar16 = '\x02';
            goto LAB_006d59f0;
          }
          if (cVar16 != '\x02') {
            if (cVar16 == '\x03') {
              cVar16 = '\x03';
              goto LAB_006d59f0;
            }
            goto LAB_006d608a;
          }
          uVar18 = 0x100000000000000;
        }
        *(ulong *)((long)pvVar3 + 0x18) =
             *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffff | uVar18;
        pVVar7 = p->vObjs;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar7->nSize);
  }
  iVar5 = p->nRegs;
  uVar11 = p->nObjs[3] - iVar5;
  pVVar7 = p->vCos;
  if ((int)uVar11 < pVVar7->nSize) {
    uVar18 = (ulong)uVar11;
    do {
      if ((int)uVar11 < 0) goto LAB_006d606b;
      pvVar3 = pVVar7->pArray[uVar18];
      bVar13 = *(byte *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x1f);
      uVar10 = (ulong)bVar13;
      if ((*(ulong *)((long)pvVar3 + 8) & 1) != 0) {
        bVar13 = bVar13 - 1;
        if (2 < bVar13) {
LAB_006d608a:
          __assert_fail("Value == AIG_XVSX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTsim.c"
                        ,0x2e,"int Aig_XsimInv(int)");
        }
        uVar10 = *(ulong *)(&DAT_00a26a50 + (ulong)bVar13 * 8);
      }
      *(ulong *)((long)pvVar3 + 0x18) =
           *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffff | uVar10 << 0x38;
      uVar18 = uVar18 + 1;
      pVVar7 = p->vCos;
    } while ((int)uVar18 < pVVar7->nSize);
    iVar5 = p->nRegs;
  }
  if (0 < iVar5) {
    iVar14 = 0;
    do {
      uVar11 = (p->nObjs[3] - iVar5) + iVar14;
      if (((((int)uVar11 < 0) || (p->vCos->nSize <= (int)uVar11)) ||
          (uVar15 = (p->nObjs[2] - iVar5) + iVar14, (int)uVar15 < 0)) ||
         (p->vCis->nSize <= (int)uVar15)) goto LAB_006d606b;
      pvVar3 = p->vCis->pArray[uVar15];
      uVar18 = *(ulong *)((long)p->vCos->pArray[uVar11] + 0x18);
      if (uVar17 < 300) {
        uVar10 = *(ulong *)((long)pvVar3 + 0x18);
        uVar12 = uVar18 & 0xff00000000000000;
LAB_006d5b5d:
        *(ulong *)((long)pvVar3 + 0x18) = uVar10 & 0xffffffffffffff | uVar12;
      }
      else {
        uVar10 = *(ulong *)((long)pvVar3 + 0x18);
        uVar12 = 0x300000000000000;
        if (0xffffffffffffff < (uVar18 ^ uVar10)) goto LAB_006d5b5d;
      }
      iVar14 = iVar14 + 1;
      iVar5 = p->nRegs;
    } while (iVar14 < iVar5);
  }
  uVar17 = uVar17 + 1;
  if (uVar17 == 1000) {
LAB_006d5b94:
    __format = 
    "Aig_ManTernarySimulate(): Did not reach a fixed point after %d iterations (not a bug).\n";
    uVar18 = 1000;
LAB_006d5ba0:
    printf(__format,uVar18);
LAB_006d5ba7:
    Aig_TsiStop(p_00);
    return (Vec_Ptr_t *)0x0;
  }
  goto LAB_006d5843;
}

Assistant:

Vec_Ptr_t * Aig_ManTernarySimulate( Aig_Man_t * p, int fVerbose, int fVeryVerbose )
{
    Aig_Tsi_t * pTsi;
    Vec_Ptr_t * vMap;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    unsigned * pState;//, * pPrev;
    int i, f, fConstants, Value, nCounter, nRetired;
    // allocate the simulation manager
    pTsi = Aig_TsiStart( p );
    // initialize the values
    Aig_ObjSetXsim( Aig_ManConst1(p), AIG_XVS1 );
    Aig_ManForEachPiSeq( p, pObj, i )
        Aig_ObjSetXsim( pObj, AIG_XVSX );
    Aig_ManForEachLoSeq( p, pObj, i )
        Aig_ObjSetXsim( pObj, AIG_XVS0 );
    // simulate for the given number of timeframes
    for ( f = 0; f < TSI_MAX_ROUNDS; f++ )
    {
        // collect this state
        pState = Aig_TsiStateNew( pTsi );
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        {
            Value = Aig_ObjGetXsim(pObjLo);
            if ( Value & 1 )
                Abc_InfoSetBit( pState, 2 * i );
            if ( Value & 2 )
                Abc_InfoSetBit( pState, 2 * i + 1 );
        }

//        printf( "%d ", Aig_TsiStateCount(pTsi, pState) );
if ( fVeryVerbose )
{
printf( "%3d : ", f );
Aig_TsiStatePrint( pTsi, pState );
}
        // check if this state exists
        if ( Aig_TsiStateLookup( pTsi, pState, pTsi->nWords ) )
            break;
//        nCounter = 0;
//        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
//            nCounter += (Aig_ObjGetXsim(pObjLo) == AIG_XVS0);
//printf( "%d -> ", nCounter );
        // insert this state
        Aig_TsiStateInsert( pTsi, pState, pTsi->nWords );
        // simulate internal nodes
        Aig_ManForEachNode( p, pObj, i )
        {
            Aig_ObjSetXsim( pObj, Aig_XsimAnd(Aig_ObjGetXsimFanin0(pObj), Aig_ObjGetXsimFanin1(pObj)) );
//            printf( "%d %d    Id = %2d.  Value = %d.\n", 
//                Aig_ObjGetXsimFanin0(pObj), Aig_ObjGetXsimFanin1(pObj),
//                i, Aig_XsimAnd(Aig_ObjGetXsimFanin0(pObj), Aig_ObjGetXsimFanin1(pObj)) );
        }
        // transfer the latch values
        Aig_ManForEachLiSeq( p, pObj, i )
            Aig_ObjSetXsim( pObj, Aig_ObjGetXsimFanin0(pObj) );
        nCounter = 0;
        nRetired = 0;
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        {
            if ( f < TSI_ONE_SERIES )
                Aig_ObjSetXsim( pObjLo, Aig_ObjGetXsim(pObjLi) );
            else
            {
                if ( Aig_ObjGetXsim(pObjLi) != Aig_ObjGetXsim(pObjLo) )
                {
                    Aig_ObjSetXsim( pObjLo, AIG_XVSX );
                    nRetired++;
                }
            }
            nCounter += (Aig_ObjGetXsim(pObjLo) == AIG_XVS0);
        }
//        if ( nRetired )
//        printf( "Retired %d registers.\n", nRetired );

//        if ( f && (f % 1000 == 0) )
//            printf( "%d \n", f );
//printf( "%d  ", nCounter );
    }
//printf( "\n" );
    if ( f == TSI_MAX_ROUNDS )
    {
        printf( "Aig_ManTernarySimulate(): Did not reach a fixed point after %d iterations (not a bug).\n", TSI_MAX_ROUNDS );
        Aig_TsiStop( pTsi );
        return NULL;
    }
    // OR all the states
    pState = (unsigned *)Vec_PtrEntry( pTsi->vStates, 0 );
    Aig_TsiStateOrAll( pTsi, pState );
    // check if there are constants
    fConstants = 0;
    if ( 2*Aig_ManRegNum(p) == 32*pTsi->nWords )
    {
        for ( i = 0; i < pTsi->nWords; i++ )
            if ( pState[i] != ~0 )
                fConstants = 1;
    }
    else
    {
        for ( i = 0; i < pTsi->nWords - 1; i++ )
            if ( pState[i] != ~0 )
                fConstants = 1;
        if ( pState[i] != Abc_InfoMask( 2*Aig_ManRegNum(p) - 32*(pTsi->nWords-1) ) )
            fConstants = 1;
    }
    if ( fConstants == 0 )
    {
        if ( fVerbose )
        printf( "Detected 0 constants after %d iterations of ternary simulation.\n", f );
        Aig_TsiStop( pTsi );
        return NULL;
    }

    // start mapping by adding the true PIs
    vMap = Vec_PtrAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Vec_PtrPush( vMap, pObj );
    // find constant registers
    nCounter = 0;
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
        nCounter += (Value == 1 || Value == 2);
        if ( Value == 1 )
            Vec_PtrPush( vMap, Aig_ManConst0(p) );
        else if ( Value == 2 )
            Vec_PtrPush( vMap, Aig_ManConst1(p) );
        else if ( Value == 3 )
            Vec_PtrPush( vMap, pObjLo );
        else
            assert( 0 );
//        Aig_XsimPrint( stdout, Value );
    }
//    printf( "\n" );
    Aig_TsiStop( pTsi );
    if ( fVerbose )
    printf( "Detected %d constants after %d iterations of ternary simulation.\n", nCounter, f );
    return vMap;
}